

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O2

path * __thiscall
mdsplit::mdsplitter::relative_path
          (path *__return_storage_ptr__,mdsplitter *this,path *path,path *base)

{
  bool bVar1;
  bool bVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  path *this_00;
  string ext;
  path base_dir;
  path local_a0;
  path local_78;
  path local_50;
  
  bVar1 = std::filesystem::is_directory(base);
  if (bVar1) {
    std::filesystem::__cxx11::path::path(&local_50,base);
  }
  else {
    std::filesystem::__cxx11::path::parent_path();
  }
  bVar1 = is_subdirectory(this,path,&this->output_dir_);
  bVar2 = std::filesystem::__cxx11::operator==(path,&this->output_dir_);
  if ((!bVar2) && (bVar1)) {
    std::filesystem::relative(__return_storage_ptr__,path);
    std::filesystem::__cxx11::path::extension(&local_a0,__return_storage_ptr__);
    std::filesystem::__cxx11::path::string(&local_78._M_pathname,&local_a0);
    std::filesystem::__cxx11::path::~path(&local_a0);
    std::__cxx11::string::~string((string *)&local_78);
    goto LAB_00122a41;
  }
  std::filesystem::current_path_abi_cxx11_();
  bVar1 = is_subdirectory(this,path,&local_a0);
  std::filesystem::__cxx11::path::~path(&local_a0);
  if (bVar1) {
    if ((this->repository_)._M_string_length == 0) {
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(&local_a0,path);
      pbVar3 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_a0);
      poVar4 = std::operator<<((ostream *)pbVar3,
                               " is outside the output directory but you have not provided a repository to mdsplit. This will generate a broken link."
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      std::filesystem::__cxx11::path::~path(&local_a0);
      std::filesystem::__cxx11::path::~path(&local_78);
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(__return_storage_ptr__,path);
      goto LAB_00122a37;
    }
    std::filesystem::__cxx11::path::path(__return_storage_ptr__);
    bVar1 = is_external(&this->repository_);
    if (!bVar1) {
      std::filesystem::__cxx11::path::operator/=
                (__return_storage_ptr__,(char (*) [19])"https://github.com");
    }
    std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,&this->repository_);
    std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,(char (*) [12])"blob/master");
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::relative(&local_a0,path);
    std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,&local_a0);
    std::filesystem::__cxx11::path::~path(&local_a0);
    this_00 = &local_78;
  }
  else {
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::relative(&local_a0,path);
    pbVar3 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_a0);
    poVar4 = std::operator<<((ostream *)pbVar3,
                             " is outside the project directory. There\'s no way to generate a relative link that will work elsewhere. This will generate a broken link in your documentation."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    std::filesystem::__cxx11::path::~path(&local_a0);
    std::filesystem::__cxx11::path::~path(&local_78);
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::relative(__return_storage_ptr__,path);
LAB_00122a37:
    this_00 = &local_a0;
  }
  std::filesystem::__cxx11::path::~path(this_00);
LAB_00122a41:
  std::filesystem::__cxx11::path::~path(&local_50);
  return __return_storage_ptr__;
}

Assistant:

fs::path mdsplitter::relative_path(const fs::path &path,
                                       const fs::path &base) {
        fs::path base_dir = fs::is_directory(base) ? base : base.parent_path();
        bool is_in_docs_dir = is_subdirectory(path, output_dir_);
        bool is_docs_dir = path == this->output_dir_;
        if (is_in_docs_dir && !is_docs_dir) {
            fs::path r = fs::relative(path, base_dir);
            std::string ext = r.extension().string();
            // GitHub does not convert ".md#anchor" links automatically
            /*
            bool is_anchor_inside_docs = ext.rfind(".md#", 0) == 0;
            if (is_anchor_inside_docs) {
                ext.replace(0, 4, ".html#");
                r = r.parent_path() / r.stem();
                r += ext;
            }
             */
            return r;
        } else {
            bool is_in_project_dir = is_subdirectory(path, fs::current_path());
            if (is_in_project_dir) {
                if (!repository_.empty()) {
                    fs::path url;
                    if (!is_external(repository_)) {
                        url /= "https://github.com";
                    }
                    url /= repository_;
                    url /= "blob/master";
                    url /= fs::relative(path, fs::current_path());
                    return url;
                } else {
                    std::cerr << fs::relative(path, fs::current_path())
                              << " is outside the output directory but you "
                                 "have not provided a repository to mdsplit. "
                                 "This will generate a broken link."
                              << std::endl;
                    return fs::relative(path, fs::current_path());
                }
            } else {
                std::cerr
                    << fs::relative(path, fs::current_path())
                    << " is outside the project directory. There's no way to "
                       "generate a relative link that will work elsewhere. "
                       "This will generate a broken link in your documentation."
                    << std::endl;
                return fs::relative(path, fs::current_path());
            }
        }
    }